

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat_room.cpp
# Opt level: O0

PersonReference __thiscall ChatRoom::join(ChatRoom *this,string *name)

{
  bool bVar1;
  element_type *__lhs;
  __shared_ptr_access<Person,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  reference pvVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PersonReference PVar4;
  shared_ptr<Person> local_b8;
  undefined1 local_a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  allocator<char> local_61;
  string local_60;
  __shared_ptr_access<Person,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_40;
  shared_ptr<Person> *p;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_> *__range1;
  string *name_local;
  ChatRoom *this_local;
  
  __end1 = std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>::begin
                     ((vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_> *)
                      name);
  p = (shared_ptr<Person> *)
      std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>::end
                ((vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_> *)name)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
                                *)&p);
    if (!bVar1) break;
    local_40 = (__shared_ptr_access<Person,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
               ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<Person,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (local_40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Room",&local_61);
    __lhs = std::__shared_ptr_access<Person,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      (local_40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_a8 + 0x10),&__lhs->m_name," has joined the chat...");
    Person::recieve(peVar2,&local_60,(string *)(local_a8 + 0x10));
    std::__cxx11::string::~string((string *)(local_a8 + 0x10));
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Person>_*,_std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>_>
    ::operator++(&__end1);
  }
  std::make_shared<Person,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  std::vector<std::shared_ptr<Person>,std::allocator<std::shared_ptr<Person>>>::
  emplace_back<std::shared_ptr<Person>>
            ((vector<std::shared_ptr<Person>,std::allocator<std::shared_ptr<Person>>> *)name,
             (shared_ptr<Person> *)local_a8);
  std::shared_ptr<Person>::~shared_ptr((shared_ptr<Person> *)local_a8);
  this_00 = (__shared_ptr_access<Person,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>::back
                      ((vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_> *
                       )name);
  peVar2 = std::__shared_ptr_access<Person,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (this_00);
  Person::set_hub(peVar2,(ChatRoom *)name);
  pvVar3 = std::vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_>::back
                     ((vector<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_> *)
                      name);
  std::shared_ptr<Person>::shared_ptr(&local_b8,pvVar3);
  PersonReference::PersonReference((PersonReference *)this,&local_b8);
  std::shared_ptr<Person>::~shared_ptr(&local_b8);
  PVar4.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar4.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PersonReference)PVar4.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ChatRoom::PersonReference ChatRoom::join(std::string name)
{
	for(auto& p : m_people)
	{
		p->recieve("Room", p->m_name + " has joined the chat...");
	}

	m_people.emplace_back(std::make_shared<Person>(name));
	m_people.back()->set_hub(*this);
	return m_people.back();
}